

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_jpege_vepu511.c
# Opt level: O0

MPP_RET vepu511_set_jpeg_reg(Vepu511JpegCfg *cfg)

{
  RK_U32 RVar1;
  HalEncTask *task_00;
  JpegeSyntax *syn_00;
  int *piVar2;
  Vepu541Fmt *pVVar3;
  MppDev pvVar4;
  int iVar5;
  MppFrameFormat MVar6;
  RK_U32 RVar7;
  size_t sVar8;
  uint local_5c;
  uint local_58;
  uint local_54;
  uint local_40;
  uint local_3c;
  RK_S32 stridec;
  RK_S32 stridey;
  RK_U32 pic_height_align8;
  RK_U32 pic_width_align8;
  VepuFmtCfg *fmt;
  Vepu511JpegReg *regs;
  JpegeSyntax *syn;
  HalEncTask *task;
  Vepu511JpegCfg *cfg_local;
  
  task_00 = (HalEncTask *)cfg->enc_task;
  syn_00 = (JpegeSyntax *)(task_00->syntax).data;
  piVar2 = (int *)cfg->jpeg_reg_base;
  pVVar3 = (Vepu541Fmt *)cfg->input_fmt;
  local_3c = 0;
  RVar7 = syn_00->width;
  RVar1 = syn_00->height;
  iVar5 = mpp_buffer_get_fd_with_caller(task_00->input,"vepu511_set_jpeg_reg");
  piVar2[8] = iVar5;
  piVar2[9] = piVar2[8];
  piVar2[10] = piVar2[8];
  vepu511_jpeg_set_patch_info(cfg->dev,syn_00,*pVVar3,task_00);
  iVar5 = mpp_buffer_get_fd_with_caller(task_00->output,"vepu511_set_jpeg_reg");
  *piVar2 = iVar5;
  piVar2[1] = *piVar2;
  piVar2[2] = *piVar2;
  piVar2[3] = *piVar2;
  pvVar4 = cfg->dev;
  sVar8 = mpp_packet_get_length(task_00->packet);
  mpp_dev_set_reg_offset(pvVar4,0x102,(RK_U32)sVar8);
  pvVar4 = cfg->dev;
  sVar8 = mpp_buffer_get_size_with_caller(task_00->output,"vepu511_set_jpeg_reg");
  mpp_dev_set_reg_offset(pvVar4,0x100,(RK_U32)sVar8);
  piVar2[0x10] = piVar2[0x10] & 0xfffff800U | (RVar7 + 7 >> 3) - 1 & 0x7ff;
  if ((syn_00->width & 7) == 0) {
    local_54 = 0;
  }
  else {
    local_54 = 8 - (syn_00->width & 7);
  }
  piVar2[0x11] = piVar2[0x11] & 0xffffffc0U | local_54 & 0x3f;
  piVar2[0x10] = piVar2[0x10] & 0xf800ffffU | ((RVar1 + 7 >> 3) - 1 & 0x7ff) << 0x10;
  if ((syn_00->height & 7) == 0) {
    local_58 = 0;
  }
  else {
    local_58 = 8 - (syn_00->height & 7);
  }
  piVar2[0x11] = piVar2[0x11] & 0xffc0ffffU | (local_58 & 0x3f) << 0x10;
  piVar2[0x12] = piVar2[0x12] & 0xffffffc3U | (*pVVar3 & (VEPU580_FMT_BUTT|VEPU541_FMT_BGR888)) << 2
  ;
  piVar2[0x12] = piVar2[0x12] & ~VEPU541_FMT_BGR888 | pVVar3[1] & VEPU541_FMT_BGR888;
  piVar2[0x12] = piVar2[0x12] & 0xfffffffdU | (pVVar3[2] & VEPU541_FMT_BGR888) << 1;
  piVar2[0x12] = piVar2[0x12] & 0xfffffeff;
  piVar2[0x12] = piVar2[0x12] & 0xfffffdff;
  piVar2[0x12] = piVar2[0x12] & 0xfffffbff;
  piVar2[0x17] = piVar2[0x17] & 0xfbffffffU | (uint)(0 < syn_00->mirroring) << 0x1a;
  piVar2[0x17] = piVar2[0x17] & 0xe7ffffffU | (syn_00->rotation & MPP_ENC_ROT_270) << 0x1b;
  MVar6 = mpp_frame_get_fmt(task_00->frame);
  if ((MVar6 & 0xf00000) == MPP_FMT_YUV420SP) {
    if (syn_00->hor_stride == 0) {
      if (((uint)piVar2[0x12] >> 2 & 0xf) == 0) {
        local_3c = syn_00->width << 2;
      }
      else if (((((uint)piVar2[0x12] >> 2 & 0xf) == 1) || (((uint)piVar2[0x12] >> 2 & 0xf) == 0xd))
              || (((uint)piVar2[0x12] >> 2 & 0xf) == 0xc)) {
        local_3c = syn_00->width * 3;
      }
      else if (((((uint)piVar2[0x12] >> 2 & 0xf) == 2) || (((uint)piVar2[0x12] >> 2 & 0xf) == 8)) ||
              (((uint)piVar2[0x12] >> 2 & 0xf) == 9)) {
        local_3c = syn_00->width << 1;
      }
    }
    else {
      local_3c = syn_00->hor_stride;
    }
  }
  else {
    piVar2[0x17] = piVar2[0x17] & 0xbfffffffU | 0x40000000;
    local_3c = mpp_frame_get_fbc_hdr_stride(task_00->frame);
    if (local_3c == 0) {
      local_3c = (syn_00->hor_stride + 0xf & 0xfffffff0) >> 2;
    }
  }
  if (((((uint)piVar2[0x12] >> 2 & 0xf) == 4) || (((uint)piVar2[0x12] >> 2 & 0xf) == 6)) ||
     (((uint)piVar2[0x12] >> 2 & 0xf) == 0xd)) {
    local_5c = local_3c;
  }
  else {
    local_5c = (int)local_3c / 2;
  }
  local_40 = local_5c;
  if (((uint)piVar2[0x12] >> 2 & 0xf) == 0xc) {
    local_40 = local_3c << 1;
  }
  if (((uint)piVar2[0x12] >> 2 & 0xf) < 3) {
    piVar2[0x13] = piVar2[0x13] & 0xf803ffffU | 0x1080000;
    piVar2[0x13] = piVar2[0x13] & 0xfffc01ffU | 0x10200;
    piVar2[0x13] = piVar2[0x13] & 0xfffffe00U | 0x19;
    piVar2[0x14] = piVar2[0x14] & 0xf803ffffU | 0x7680000;
    piVar2[0x14] = piVar2[0x14] & 0xfffc01ffU | 0x36c00;
    piVar2[0x14] = piVar2[0x14] & 0xfffffe00U | 0x70;
    piVar2[0x15] = piVar2[0x15] & 0xf803ffffU | 0x1c00000;
    piVar2[0x15] = piVar2[0x15] & 0xfffc01ffU | 0x34400;
    piVar2[0x15] = piVar2[0x15] & 0xfffffe00U | 0x1ee;
    piVar2[0x16] = piVar2[0x16] & 0xffe0ffffU | 0x100000;
    piVar2[0x16] = piVar2[0x16] & 0xffff00ffU | 0x8000;
    piVar2[0x16] = piVar2[0x16] & 0xffffff00U | 0x80;
  }
  piVar2[0x19] = piVar2[0x19] & 0xffe00000U | local_3c & 0x1fffff;
  piVar2[0x1a] = piVar2[0x1a] & 0xffff0000U | local_40 & 0xffff;
  RVar7 = mpp_frame_get_offset_y(task_00->frame);
  piVar2[0x18] = piVar2[0x18] & 0xc000ffffU | (RVar7 & 0x3fff) << 0x10;
  RVar7 = mpp_frame_get_offset_x(task_00->frame);
  piVar2[0x18] = piVar2[0x18] & 0xffffc000U | RVar7 & 0x3fff;
  piVar2[0x1c] = piVar2[0x1c] & 0xffff8000;
  piVar2[0x1d] = piVar2[0x1d] & 0xffff8000;
  piVar2[0x1e] = piVar2[0x1e] & 0xffff8000;
  piVar2[0x1f] = piVar2[0x1f] & 0xfe000000U | syn_00->restart_ri & 0x1ffffff;
  piVar2[0x1f] = piVar2[0x1f] & 0xfdffffff;
  piVar2[0x1f] = piVar2[0x1f] & 0xe3ffffff;
  piVar2[0x1f] = piVar2[0x1f] & 0xdfffffffU | 0x20000000;
  piVar2[0x1f] = piVar2[0x1f] & 0x7fffffffU | 0x80000000;
  piVar2[0x20] = piVar2[0x20] & 0xfffff000;
  piVar2[0x20] = piVar2[0x20] & 0xff000fff;
  piVar2[0x20] = piVar2[0x20] & 0xc0ffffff;
  return MPP_OK;
}

Assistant:

MPP_RET vepu511_set_jpeg_reg(Vepu511JpegCfg *cfg)
{
    HalEncTask *task = ( HalEncTask *)cfg->enc_task;
    JpegeSyntax *syn = (JpegeSyntax *)task->syntax.data;
    Vepu511JpegReg *regs = (Vepu511JpegReg *)cfg->jpeg_reg_base;
    VepuFmtCfg *fmt = (VepuFmtCfg *)cfg->input_fmt;
    RK_U32 pic_width_align8, pic_height_align8;
    RK_S32 stridey = 0;
    RK_S32 stridec = 0;

    pic_width_align8 = (syn->width + 7) & (~7);
    pic_height_align8 = (syn->height + 7) & (~7);

    regs->adr_src0 =  mpp_buffer_get_fd(task->input);
    regs->adr_src1 = regs->adr_src0;
    regs->adr_src2 = regs->adr_src0;

    vepu511_jpeg_set_patch_info(cfg->dev, syn, (Vepu541Fmt) fmt->format, task);

    regs->adr_bsbt = mpp_buffer_get_fd(task->output);
    regs->adr_bsbb = regs->adr_bsbt;
    regs->adr_bsbs = regs->adr_bsbt;
    regs->adr_bsbr = regs->adr_bsbt;

    mpp_dev_set_reg_offset(cfg->dev, 258, mpp_packet_get_length(task->packet));
    mpp_dev_set_reg_offset(cfg->dev, 256, mpp_buffer_get_size(task->output));

    regs->enc_rsl.pic_wd8_m1    = pic_width_align8 / 8 - 1;
    regs->src_fill.pic_wfill    = (syn->width & 0x7)
                                  ? (8 - (syn->width & 0x7)) : 0;
    regs->enc_rsl.pic_hd8_m1    = pic_height_align8 / 8 - 1;
    regs->src_fill.pic_hfill    = (syn->height & 0x7)
                                  ? (8 - (syn->height & 0x7)) : 0;

    regs->src_fmt.src_cfmt = fmt->format;
    regs->src_fmt.alpha_swap = fmt->alpha_swap;
    regs->src_fmt.rbuv_swap  = fmt->rbuv_swap;
    regs->src_fmt.src_range_trns_en  = 0;
    regs->src_fmt.src_range_trns_sel = 0;
    regs->src_fmt.chroma_ds_mode     = 0;
    regs->src_proc.src_mirr = syn->mirroring > 0;
    regs->src_proc.src_rot = syn->rotation;

    if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(task->frame))) {
        regs->src_proc.rkfbcd_en = 1;

        stridey = mpp_frame_get_fbc_hdr_stride(task->frame);
        if (!stridey)
            stridey = MPP_ALIGN(syn->hor_stride, 16) >> 2;
    } else if (syn->hor_stride) {
        stridey = syn->hor_stride;
    } else {
        if (regs->src_fmt.src_cfmt == VEPU541_FMT_BGRA8888 )
            stridey = syn->width * 4;
        else if (regs->src_fmt.src_cfmt == VEPU541_FMT_BGR888 ||
                 regs->src_fmt.src_cfmt == VEPU580_FMT_YUV444P ||
                 regs->src_fmt.src_cfmt == VEPU580_FMT_YUV444SP)
            stridey = syn->width * 3;
        else if (regs->src_fmt.src_cfmt == VEPU541_FMT_BGR565 ||
                 regs->src_fmt.src_cfmt == VEPU541_FMT_YUYV422 ||
                 regs->src_fmt.src_cfmt == VEPU541_FMT_UYVY422)
            stridey = syn->width * 2;
    }

    stridec = (regs->src_fmt.src_cfmt == VEPU541_FMT_YUV422SP ||
               regs->src_fmt.src_cfmt == VEPU541_FMT_YUV420SP ||
               regs->src_fmt.src_cfmt == VEPU580_FMT_YUV444P) ?
              stridey : stridey / 2;

    if (regs->src_fmt.src_cfmt == VEPU580_FMT_YUV444SP)
        stridec = stridey * 2;

    if (regs->src_fmt.src_cfmt < VEPU541_FMT_NONE) {
        regs->src_udfy.csc_wgt_r2y = 66;
        regs->src_udfy.csc_wgt_g2y = 129;
        regs->src_udfy.csc_wgt_b2y = 25;

        regs->src_udfu.csc_wgt_r2u = -38;
        regs->src_udfu.csc_wgt_g2u = -74;
        regs->src_udfu.csc_wgt_b2u = 112;

        regs->src_udfv.csc_wgt_r2v = 112;
        regs->src_udfv.csc_wgt_g2v = -94;
        regs->src_udfv.csc_wgt_b2v = -18;

        regs->src_udfo.csc_ofst_y = 16;
        regs->src_udfo.csc_ofst_u = 128;
        regs->src_udfo.csc_ofst_v = 128;
    }

    regs->src_strd0.src_strd0  = stridey;
    regs->src_strd1.src_strd1  = stridec;
    regs->pic_ofst.pic_ofst_y = mpp_frame_get_offset_y(task->frame);
    regs->pic_ofst.pic_ofst_x = mpp_frame_get_offset_x(task->frame);

    regs->y_cfg.bias_y = 0;
    regs->u_cfg.bias_u = 0;
    regs->v_cfg.bias_v = 0;

    regs->base_cfg.ri  = syn->restart_ri;
    regs->base_cfg.out_mode = 0;
    regs->base_cfg.start_rst_m = 0;
    regs->base_cfg.pic_last_ecs = 1;
    regs->base_cfg.stnd = 1;

    regs->uvc_cfg.uvc_partition0_len = 0;
    regs->uvc_cfg.uvc_partition_len = 0;
    regs->uvc_cfg.uvc_skip_len = 0;
    return MPP_OK;
}